

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22ecb::RcExternMethodsInterfaceTest::TestGetLoopFilterLevelRateControl
          (RcExternMethodsInterfaceTest *this)

{
  bool bVar1;
  AomAV1LoopfilterLevel AVar2;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AomAV1LoopfilterLevel lpf_level;
  AssertionResult gtest_ar;
  AomAV1RateControlRTC *controller;
  AomAV1RateControlRtcConfig *in_stack_fffffffffffffec8;
  AomAV1RateControlRTC *in_stack_fffffffffffffed0;
  AomAV1RateControlRTC **in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  int line;
  char *in_stack_fffffffffffffef0;
  Type in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 uVar3;
  AssertionResult local_f8 [2];
  undefined4 local_d4;
  AssertionResult local_d0;
  Message *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar4;
  AssertionResult local_a8 [2];
  undefined4 local_84;
  AssertionResult local_80;
  AomAV1LoopfilterLevel local_6c;
  int local_5c [2];
  undefined8 local_54;
  uint local_4c;
  undefined8 local_28;
  AssertionResult local_20;
  AomAV1RateControlRTC *local_10;
  
  local_10 = av1_ratecontrol_rtc_create(in_stack_fffffffffffffec8);
  local_28 = 0;
  testing::internal::CmpHelperNE<AomAV1RateControlRTC*,decltype(nullptr)>
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (void **)in_stack_fffffffffffffed0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    in_stack_fffffffffffffee8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13a066);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
    testing::Message::~Message((Message *)0x13a0c3);
  }
  local_4c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a14a);
  if (local_4c == 0) {
    local_5c[0] = 0xfdbd;
    local_5c[1] = 0xfdbd;
    local_54 = 0xfdbd0000fdbd;
    AVar2 = av1_ratecontrol_rtc_get_loop_filter_level((AomAV1RateControlRTC *)0x13a195);
    local_6c.filter_level = AVar2.filter_level;
    local_5c[0] = local_6c.filter_level[0];
    local_5c[1] = local_6c.filter_level[1];
    local_6c._8_8_ = AVar2._8_8_;
    local_54._0_4_ = local_6c.filter_level_u;
    local_54._4_4_ = local_6c.filter_level_v;
    local_84 = 0xfdbd;
    local_6c = AVar2;
    testing::internal::CmpHelperNE<int,int>
              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8,
               (int *)in_stack_fffffffffffffed0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      in_stack_fffffffffffffee0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x13a241);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
                 (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_stack_fffffffffffffee0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
      testing::Message::~Message((Message *)0x13a29e);
    }
    local_4c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a322);
    if (local_4c == 0) {
      uVar4 = 0xfdbd;
      testing::internal::CmpHelperNE<int,int>
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 (int *)in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
      if (!bVar1) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        in_stack_fffffffffffffed8 =
             (AomAV1RateControlRTC **)
             testing::AssertionResult::failure_message((AssertionResult *)0x13a3b4);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
                   (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_stack_fffffffffffffee0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(uVar4,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
        testing::Message::~Message((Message *)0x13a408);
      }
      local_4c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a489);
      if (local_4c == 0) {
        local_d4 = 0xfdbd;
        testing::internal::CmpHelperNE<int,int>
                  (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   (int *)in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          in_stack_fffffffffffffed0 =
               (AomAV1RateControlRTC *)
               testing::AssertionResult::failure_message((AssertionResult *)0x13a509);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
                     (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),in_stack_fffffffffffffee0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(uVar4,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
          testing::Message::~Message((Message *)0x13a557);
        }
        local_4c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a5d2);
        if (local_4c == 0) {
          uVar3 = 0xfdbd;
          testing::internal::CmpHelperNE<int,int>
                    (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     (int *)in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
          line = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
          if (!bVar1) {
            testing::Message::Message((Message *)CONCAT44(uVar3,in_stack_ffffffffffffff00));
            testing::AssertionResult::failure_message((AssertionResult *)0x13a64f);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT44(uVar3,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,line,
                       in_stack_fffffffffffffee0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(uVar4,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffed0);
            testing::Message::~Message((Message *)0x13a69b);
          }
          local_4c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x13a713);
          if (local_4c == 0) {
            av1_ratecontrol_rtc_destroy(in_stack_fffffffffffffed0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RcExternMethodsInterfaceTest::TestGetLoopFilterLevelRateControl() {
  AomAV1RateControlRTC *controller = av1_ratecontrol_rtc_create(&rc_cfg_);
  ASSERT_NE(controller, nullptr);

  AomAV1LoopfilterLevel lpf_level;
  lpf_level.filter_level[0] = 0xfdbd;
  lpf_level.filter_level[1] = 0xfdbd;
  lpf_level.filter_level_u = 0xfdbd;
  lpf_level.filter_level_v = 0xfdbd;

  lpf_level = av1_ratecontrol_rtc_get_loop_filter_level(controller);

  ASSERT_NE(lpf_level.filter_level[0], 0xfdbd);
  ASSERT_NE(lpf_level.filter_level[1], 0xfdbd);
  ASSERT_NE(lpf_level.filter_level_u, 0xfdbd);
  ASSERT_NE(lpf_level.filter_level_v, 0xfdbd);

  av1_ratecontrol_rtc_destroy(controller);
}